

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

void cJSON_AddItemToArray(cJSON *array,cJSON *item)

{
  cJSON *local_20;
  cJSON *child;
  cJSON *item_local;
  cJSON *array_local;
  
  if ((item != (cJSON *)0x0) && (array != (cJSON *)0x0)) {
    local_20 = array->child;
    if (local_20 == (cJSON *)0x0) {
      array->child = item;
    }
    else {
      for (; local_20->next != (cJSON *)0x0; local_20 = local_20->next) {
      }
      suffix_object(local_20,item);
    }
  }
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_AddItemToArray(cJSON *array, cJSON *item)
{
    cJSON *child = NULL;

    if ((item == NULL) || (array == NULL))
    {
        return;
    }

    child = array->child;

    if (child == NULL)
    {
        /* list is empty, start new one */
        array->child = item;
    }
    else
    {
        /* append to the end */
        while (child->next)
        {
            child = child->next;
        }
        suffix_object(child, item);
    }
}